

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdpeer.cc
# Opt level: O3

int operator==(bdNodeId *a,bdNodeId *b)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint8_t *b_data;
  uint8_t *a_data;
  
  uVar4 = 0;
  if (a->data[0] == b->data[0]) {
    lVar3 = 0;
    do {
      uVar4 = (uint)lVar3;
      if (uVar4 == 0x13) break;
      lVar1 = lVar3 + 1;
      lVar2 = lVar3 + 1;
      lVar3 = lVar3 + 1;
    } while (a->data[lVar1] == b->data[lVar2]);
    uVar4 = (uint)(0x12 < uVar4);
  }
  return uVar4;
}

Assistant:

int operator==(const bdNodeId &a, const bdNodeId &b) {
	uint8_t *a_data = (uint8_t *) a.data;
	uint8_t *b_data = (uint8_t *) b.data;
	for (int i = 0; i < BITDHT_KEY_LEN; i++)
	{
		if (*a_data < *b_data) {
			return 0;
		}
		else if (*a_data > *b_data) {
			return 0;
		}
		a_data++;
		b_data++;
	}
	return 1;
}